

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O1

void __thiscall FloatingDisplay::saveSettings(FloatingDisplay *this)

{
  Master *this_00;
  QSettings *pQVar1;
  double dVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  anon_union_24_3_e3d07ef4_for_data local_38;
  
  this_00 = Master::getInstance();
  pQVar1 = Master::getSettings(this_00);
  QVar3.m_data = (storage_type *)0x18;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  local_58 = (QArrayData *)local_38.shared;
  uStack_50 = local_38._8_8_;
  local_48 = local_38._16_8_;
  QVariant::QVariant((QVariant *)&local_38,(QRect *)(*(long *)&this->field_0x20 + 0x14));
  QSettings::setValue((QString *)pQVar1,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_38);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x17;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  local_58 = (QArrayData *)local_38.shared;
  uStack_50 = local_38._8_8_;
  local_48 = local_38._16_8_;
  dVar2 = (double)QWidget::windowOpacity();
  QVariant::QVariant((QVariant *)&local_38,
                     (int)((double)((ulong)(dVar2 * 100.0) & 0x8000000000000000 |
                                   (ulong)DAT_00190bb0) + dVar2 * 100.0));
  QSettings::setValue((QString *)pQVar1,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_38);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  return;
}

Assistant:

void FloatingDisplay::saveSettings() {
	QSettings *settings = Master::getInstance()->getSettings();
	settings->setValue("FloatingDisplay/geometry", geometry());
	settings->setValue("FloatingDisplay/opacity", qRound(windowOpacity() * 100.0));
}